

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

SchnorrPubkey *
cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,ByteData256 *tweak,
          Privkey *tweaked_privkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *pCVar2;
  int pk_parity;
  Privkey local_120;
  secp256k1_xonly_pubkey x_only_pubkey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  secp256k1_keypair keypair;
  
  ByteData256::GetBytes(&tweak_bytes,tweak);
  ctx = wally_get_secp_context();
  Privkey::GetData(&local_120.data_,privkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x_only_pubkey,
                     &local_120.data_);
  iVar1 = secp256k1_keypair_create(ctx,&keypair,(uchar *)x_only_pubkey.data._0_8_);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&x_only_pubkey);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
  if (iVar1 != 1) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&x_only_pubkey,"Invalid private key",(allocator *)&local_120);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&x_only_pubkey);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar1 = secp256k1_keypair_xonly_tweak_add
                    (ctx,&keypair,
                     tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (iVar1 == 1) {
    pk_parity = 0;
    iVar1 = secp256k1_keypair_xonly_pub(ctx,&x_only_pubkey,&pk_parity,&keypair);
    if (iVar1 == 1) {
      if (tweaked_privkey != (Privkey *)0x0) {
        ByteData::ByteData((ByteData *)&local_c0,keypair.data,0x20);
        Privkey::Privkey(&local_120,(ByteData *)&local_c0,kMainnet,true);
        Privkey::operator=(tweaked_privkey,&local_120);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0)
        ;
      }
      if (parity != (bool *)0x0) {
        *parity = pk_parity != 0;
      }
      ConvertSchnorrPubkey((ByteData256 *)&local_120,&x_only_pubkey);
      SchnorrPubkey(__return_storage_ptr__,(ByteData256 *)&local_120);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return __return_storage_ptr__;
    }
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    CfdException::CfdException(pCVar2,kCfdInternalError);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&x_only_pubkey,"Could not tweak add key pair",(allocator *)&local_120);
  CfdException::CfdException(pCVar2,kCfdInternalError,(string *)&x_only_pubkey);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrPubkey SchnorrPubkey::CreateTweakAddFromPrivkey(
    const Privkey &privkey, const ByteData256 &tweak, Privkey *tweaked_privkey,
    bool *parity) {
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  auto ctx = wally_get_secp_context();

  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  ret = secp256k1_keypair_xonly_tweak_add(ctx, &keypair, tweak_bytes.data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not tweak add key pair");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);
  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (tweaked_privkey != nullptr) {
    *tweaked_privkey = Privkey(ByteData(keypair.data, Privkey::kPrivkeySize));
  }
  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}